

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ModportDeclarationSyntax * __thiscall
slang::parsing::Parser::parseModportDeclaration(Parser *this,AttrList attributes)

{
  bool bVar1;
  SourceLocation location;
  ModportItemSyntax *pMVar2;
  ModportDeclarationSyntax *pMVar3;
  Info *pIVar4;
  Info *extraout_RDX;
  Info *pIVar5;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *attributes_00;
  TokenKind TVar6;
  ulong uVar7;
  TokenKind kind;
  Token keyword;
  Token current_00;
  Token TVar8;
  Token semi;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_178;
  ulong local_168;
  undefined8 uStack_160;
  size_t local_158;
  pointer local_150;
  size_t local_148;
  Token current;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  
  keyword = ParserBase::consume(&this->super_ParserBase);
  Token::Token(&semi);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  current_00 = ParserBase::peek(&this->super_ParserBase);
  current = current_00;
  bVar1 = syntax::SyntaxFacts::isSemicolon(current_00.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,location);
    }
  }
  else {
    bVar1 = syntax::SyntaxFacts::isIdentifierOrComma(current_00.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,current_00,Semicolon,&semi,(DiagCode)0x410005);
      pIVar5 = extraout_RDX;
      goto LAB_001bf1df;
    }
    do {
      do {
        pIVar5 = current_00.info;
        pMVar2 = parseModportItem(this);
        local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar2;
        local_168 = CONCAT71(local_168._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_178._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = syntax::SyntaxFacts::isSemicolon(TVar8.kind);
        if (TVar8.kind != Comma || bVar1) goto LAB_001bf1ca;
        local_178._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_168 = local_168 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&local_178._M_first);
        TVar8 = ParserBase::peek(&this->super_ParserBase);
        pIVar4 = TVar8.info;
        kind = TVar8.kind;
        bVar1 = syntax::SyntaxFacts::isSemicolon(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_001bf1ca;
        }
        TVar6 = current_00.kind;
        uVar7 = TVar8._0_8_ & 0xffffffff;
        current_00.info = pIVar4;
        current_00.kind = (short)uVar7;
        current_00._2_1_ = (char)(uVar7 >> 0x10);
        current_00.numFlags.raw = (char)(uVar7 >> 0x18);
        current_00.rawLen = (int)(uVar7 >> 0x20);
      } while (pIVar5 != pIVar4 || TVar6 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                        (&this->super_ParserBase,(DiagCode)0x410005,true);
      uVar7 = TVar8._0_8_ & 0xffffffff;
      current_00.kind = (short)uVar7;
      current_00._2_1_ = (char)(uVar7 >> 0x10);
      current_00.numFlags.raw = (char)(uVar7 >> 0x18);
      current_00.rawLen = (int)(uVar7 >> 0x20);
    } while (bVar1);
  }
LAB_001bf1ca:
  semi = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar5 = semi.info;
LAB_001bf1df:
  local_178._8_4_ = 1;
  local_168 = 0;
  uStack_160 = 0;
  local_178._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_002da628;
  local_158 = attributes._M_extent._M_extent_value._M_extent_value;
  local_150 = attributes._M_ptr;
  local_148 = attributes._M_extent._M_extent_value._M_extent_value;
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar5);
  current.info._0_4_ = 3;
  current._0_8_ = &PTR_getChild_002db568;
  attributes_00 = &local_178;
  pMVar3 = syntax::SyntaxFactory::modportDeclaration
                     (&this->factory,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&attributes_00->_M_first
                      ,keyword,(SeparatedSyntaxList<slang::syntax::ModportItemSyntax> *)&current,
                      semi);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)&attributes_00->_M_first);
  return pMVar3;
}

Assistant:

ModportDeclarationSyntax& Parser::parseModportDeclaration(AttrList attributes) {
    auto keyword = consume();

    Token semi;
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isIdentifierOrComma, isSemicolon>(buffer, TokenKind::Semicolon, TokenKind::Comma,
                                                semi, RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseModportItem(); });

    return factory.modportDeclaration(attributes, keyword, buffer.copy(alloc), semi);
}